

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_TestShell::
TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_TestShell
          (TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_TestShell *this)

{
  TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_TestShell_00252fb0;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_NoPointsHand_Open)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::OneOfCharacters, true);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addSequence(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::NoPointsHand));
}